

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

LY_ERR cast_string_realloc(ly_ctx *ctx,uint64_t needed,char **str,uint32_t *used,uint32_t *size)

{
  uint uVar1;
  char *pcVar2;
  LY_ERR LVar3;
  uint uVar4;
  
  uVar1 = *size;
  LVar3 = LY_SUCCESS;
  if (uVar1 - *used < needed) {
    do {
      uVar4 = uVar1 + 0x10;
      if (0xffffffef < uVar1) {
        ly_log(ctx,LY_LLERR,LY_EINVAL,"XPath string length limit (%u) reached.",0xffffffffffffffff);
        return LY_EINVAL;
      }
      *size = uVar4;
      uVar1 = uVar4;
    } while (uVar4 - *used < needed);
    pcVar2 = (char *)ly_realloc(*str,(ulong)uVar4);
    *str = pcVar2;
    if (pcVar2 == (char *)0x0) {
      LVar3 = LY_EMEM;
      ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","cast_string_realloc");
    }
  }
  return LVar3;
}

Assistant:

static LY_ERR
cast_string_realloc(const struct ly_ctx *ctx, uint64_t needed, char **str, uint32_t *used, uint32_t *size)
{
    if (*size - (unsigned)*used < needed) {
        do {
            if ((UINT32_MAX - *size) < LYXP_STRING_CAST_SIZE_STEP) {
                LOGERR(ctx, LY_EINVAL, "XPath string length limit (%" PRIu32 ") reached.", UINT32_MAX);
                return LY_EINVAL;
            }
            *size += LYXP_STRING_CAST_SIZE_STEP;
        } while (*size - (unsigned)*used < needed);
        *str = ly_realloc(*str, *size * sizeof(char));
        LY_CHECK_ERR_RET(!(*str), LOGMEM(ctx), LY_EMEM);
    }

    return LY_SUCCESS;
}